

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
helics::apps::Connector::Connector
          (Connector *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  element_type *peVar1;
  string_view defaultAppName;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_68;
  ConnectionsType *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  defaultAppName._M_str = "connector";
  defaultAppName._M_len = 9;
  App::App(&this->super_App,defaultAppName,&local_48);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Connector_00452f00;
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_68._M_ptr = (element_type *)0x0;
    local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,
               (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
               (&(peVar1->super_ValueFederate).field_0x18 +
               (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]));
  }
  CoreApp::CoreApp(&this->core,(shared_ptr<helics::Core> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_refcount);
  local_50 = &this->connections;
  (this->connections)._M_h._M_buckets = &(this->connections)._M_h._M_single_bucket;
  (this->connections)._M_h._M_bucket_count = 1;
  (this->connections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connections)._M_h._M_element_count = 0;
  (this->connections)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->connections)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->matchers).
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matchers).
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->matchers).
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->regexMatchers).
  super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->regexMatchers).
  super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->regexMatchers).
  super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interfaces)._M_h._M_buckets = &(this->interfaces)._M_h._M_single_bucket;
  (this->interfaces)._M_h._M_bucket_count = 1;
  (this->interfaces)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interfaces)._M_h._M_element_count = 0;
  (this->interfaces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interfaces)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interfaces)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->matchCount = 0;
  this->interfacesRequested = 0;
  *(undefined4 *)((long)&this->interfacesRequested + 7) = 0;
  processArgs(this);
  initialSetup(this);
  return;
}

Assistant:

Connector::Connector(std::vector<std::string> args):
    App("connector", std::move(args)), core((fed) ? fed->getCorePointer() : nullptr)
{
    processArgs();
    initialSetup();
}